

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respondent.c
# Opt level: O0

int nn_respondent_events(nn_sockbase *self)

{
  nn_sockbase *local_28;
  nn_respondent *respondent;
  int events;
  nn_sockbase *self_local;
  
  local_28 = self;
  if (self == (nn_sockbase *)0x0) {
    local_28 = (nn_sockbase *)0x0;
  }
  respondent._4_4_ = nn_xrespondent_events(local_28);
  if (((ulong)local_28[0x1b].vfptr & 1) == 0) {
    respondent._4_4_ = respondent._4_4_ & 0xfffffffd;
  }
  return respondent._4_4_;
}

Assistant:

static int nn_respondent_events (struct nn_sockbase *self)
{
    int events;
    struct nn_respondent *respondent;

    respondent = nn_cont (self, struct nn_respondent, xrespondent.sockbase);

    events = nn_xrespondent_events (&respondent->xrespondent.sockbase);
    if (!(respondent->flags & NN_RESPONDENT_INPROGRESS))
        events &= ~NN_SOCKBASE_EVENT_OUT;
    return events;
}